

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  Vec_Ptr_t *p;
  void *pvVar1;
  long lVar2;
  int i;
  int i_00;
  
  if (vMasterBarrierDisjunctsArg == (Vec_Ptr_t *)0x0) {
    return;
  }
  i = 0;
  while( true ) {
    if (vMasterBarrierDisjunctsArg->nSize <= i) {
      Vec_PtrFree(vMasterBarrierDisjunctsArg);
      return;
    }
    p = (Vec_Ptr_t *)Vec_PtrEntry(vMasterBarrierDisjunctsArg,i);
    if (p == (Vec_Ptr_t *)0x0) break;
    for (i_00 = 0; i_00 < p->nSize; i_00 = i_00 + 1) {
      pvVar1 = Vec_PtrEntry(p,i_00);
      for (lVar2 = 0; lVar2 < *(int *)((long)pvVar1 + 4); lVar2 = lVar2 + 1) {
        printf("%d - ",(ulong)*(uint *)(*(long *)((long)pvVar1 + 8) + lVar2 * 4));
      }
    }
    Vec_PtrFree(p);
    i = i + 1;
  }
  __assert_fail("vPtr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/kliveness.c"
                ,0x1e8,"void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *)");
}

Assistant:

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	Vec_Ptr_t *vPtr;
	int i, j, k, iElem;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Ptr_t *, vMasterBarrierDisjunctsArg, vPtr, i)
		{	
			assert(vPtr);
			Vec_PtrForEachEntry( Vec_Int_t *, vPtr, vInt, j )
			{
				//Vec_IntFree(vInt);
				Vec_IntForEachEntry( vInt, iElem, k )
					printf("%d - ", iElem);
				//printf("Chung Chang j = %d\n", j);
			}
			Vec_PtrFree(vPtr);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}